

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O1

char ** CmdDupArgv(int argc,char **argv)

{
  char *__s;
  char **ppcVar1;
  size_t sVar2;
  char *__dest;
  ulong uVar3;
  
  ppcVar1 = (char **)malloc((long)argc * 8);
  if (0 < argc) {
    uVar3 = 0;
    do {
      __s = argv[uVar3];
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar2 = strlen(__s);
        __dest = (char *)malloc(sVar2 + 1);
        strcpy(__dest,__s);
      }
      ppcVar1[uVar3] = __dest;
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  return ppcVar1;
}

Assistant:

char ** CmdDupArgv( int argc, char **argv )
{
    char ** argvNew = ABC_ALLOC( char *, argc );
    int i;
    for ( i = 0; i < argc; i++ )
        argvNew[i] = Abc_UtilStrsav( argv[i] );
    return argvNew;
}